

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_validators.h
# Opt level: O0

bool cppcms::encoding::koi8_valid<char_const*>(char *p,char *e,size_t *count)

{
  byte bVar1;
  char *pcVar2;
  uint c;
  size_t *count_local;
  char *e_local;
  char *p_local;
  
  p_local = p;
  do {
    if (p_local == e) {
      return true;
    }
    *count = *count + 1;
    pcVar2 = p_local + 1;
    bVar1 = *p_local;
    p_local = pcVar2;
  } while ((((bVar1 == 9) || (bVar1 == 10)) || (bVar1 == 0xd)) ||
          ((0x1f < bVar1 && (bVar1 != 0x7f))));
  return false;
}

Assistant:

bool koi8_valid(Iterator p,Iterator e,size_t &count)
	{
		while(p!=e) {
			count++;
			unsigned c=(unsigned char)*p++;
			if(c==0x09 || c==0xA || c==0xD)
				continue;
			if(c<0x20 || 0x7F==c)
				return false;
		}
		return true;
	}